

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_null_with_array(void)

{
  size_type sVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  basic_variable<std::allocator<char>_> *local_5f8;
  basic_variable<std::allocator<char>_> *local_5e0;
  basic_variable<std::allocator<char>_> *local_5c0;
  basic_variable<std::allocator<char>_> *local_5a8;
  iterator local_590;
  iterator local_578;
  iterator local_560;
  iterator local_548;
  basic_variable<std::allocator<char>_> *local_530;
  basic_variable<std::allocator<char>_> local_528;
  basic_variable<std::allocator<char>_> local_4f8;
  basic_variable<std::allocator<char>_> local_4c8;
  basic_variable<std::allocator<char>_> local_498;
  undefined1 local_468 [24];
  variable expect_1;
  basic_variable<std::allocator<char>_> local_418;
  basic_variable<std::allocator<char>_> local_3e8;
  basic_variable<std::allocator<char>_> local_3b8;
  basic_variable<std::allocator<char>_> local_388;
  undefined1 local_358 [77];
  undefined1 local_30b;
  undefined1 local_30a [2];
  undefined1 local_308 [8];
  variable data_1;
  iterator local_2d0;
  iterator local_2b8;
  iterator local_2a0;
  iterator local_288;
  basic_variable<std::allocator<char>_> *local_270;
  basic_variable<std::allocator<char>_> local_268;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_1a8 [24];
  variable expect;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 local_98 [93];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xdb,"void append_suite::append_null_with_array()",local_3a,&local_3b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_158,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_128,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_f8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_c8,"alpha");
  local_98._0_8_ = &local_158;
  local_98._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10),
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  local_5a8 = (basic_variable<std::allocator<char>_> *)local_98;
  do {
    local_5a8 = local_5a8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5a8);
  } while (local_5a8 != &local_158);
  expect.storage._46_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_array<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_38);
  expect.storage._45_1_ = 1;
  sVar1 = 0xdd;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xdd,"void append_suite::append_null_with_array()",&expect.storage.field_0x2e,
             &expect.storage.field_0x2d);
  local_270 = &local_268;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_270,true);
  local_270 = &local_238;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_270,2);
  local_270 = &local_208;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_270,3.0);
  local_270 = &local_1d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_270,"alpha");
  local_1a8._0_8_ = &local_268;
  local_1a8._8_8_ = 4;
  init._M_len = sVar1;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_1a8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_1a8._0_8_,init);
  local_5c0 = (basic_variable<std::allocator<char>_> *)local_1a8;
  do {
    local_5c0 = local_5c0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5c0);
  } while (local_5c0 != &local_268);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_288,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2a0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2b8,(basic_variable<std::allocator<char>_> *)(local_1a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_2d0,(basic_variable<std::allocator<char>_> *)(local_1a8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe1,"void append_suite::append_null_with_array()",&local_288,&local_2a0,&local_2b8,
             &local_2d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_1a8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_308);
  local_30a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                           ((basic_variable<std::allocator<char>_> *)local_308);
  local_30b = 1;
  sVar1 = 0xe5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<nullable>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe5,"void append_suite::append_null_with_array()",local_30a,&local_30b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_418,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_3e8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_3b8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_388,"alpha");
  local_358._0_8_ = &local_418;
  local_358._8_8_ = 4;
  init_00._M_len = sVar1;
  init_00._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_358 + 0x10),
             (basic_array<std::allocator<char>_> *)local_358._0_8_,init_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_308,
             (basic_variable<std::allocator<char>_> *)(local_358 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_358 + 0x10));
  local_5e0 = (basic_variable<std::allocator<char>_> *)local_358;
  do {
    local_5e0 = local_5e0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5e0);
  } while (local_5e0 != &local_418);
  expect_1.storage._46_1_ =
       trial::dynamic::basic_variable<std::allocator<char>>::
       is<trial::dynamic::basic_array<std::allocator<char>>>
                 ((basic_variable<std::allocator<char>> *)local_308);
  expect_1.storage._45_1_ = 1;
  sVar1 = 0xe7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xe7,"void append_suite::append_null_with_array()",&expect_1.storage.field_0x2e,
             &expect_1.storage.field_0x2d);
  local_530 = &local_528;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_530,true);
  local_530 = &local_4f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_530,2);
  local_530 = &local_4c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_530,3.0);
  local_530 = &local_498;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_530,"alpha");
  local_468._0_8_ = &local_528;
  local_468._8_8_ = 4;
  init_01._M_len = sVar1;
  init_01._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_468 + 0x10),
             (basic_array<std::allocator<char>_> *)local_468._0_8_,init_01);
  local_5f8 = (basic_variable<std::allocator<char>_> *)local_468;
  do {
    local_5f8 = local_5f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5f8);
  } while (local_5f8 != &local_528);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_548,(basic_variable<std::allocator<char>_> *)local_308);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_560,(basic_variable<std::allocator<char>_> *)local_308);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_578,(basic_variable<std::allocator<char>_> *)(local_468 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_590,(basic_variable<std::allocator<char>_> *)(local_468 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0xeb,"void append_suite::append_null_with_array()",&local_548,&local_560,&local_578,
             &local_590);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_590);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_578);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_560);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_468 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_308);
  return;
}

Assistant:

void append_null_with_array()
{
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data += { true, 2, 3.0, "alpha" };
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
        variable expect = array::make({ true, 2, 3.0, "alpha" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    {
        variable data;
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<nullable>(), true);
        data += array::make({ true, 2, 3.0, "alpha" });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
        variable expect = array::make({ true, 2, 3.0, "alpha" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
}